

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void qpdf_set_r2_encryption_parameters_insecure
               (qpdf_data qpdf,char *user_password,char *owner_password,QPDF_BOOL allow_print,
               QPDF_BOOL allow_modify,QPDF_BOOL allow_extract,QPDF_BOOL allow_annotate)

{
  QPDFWriter::setR2EncryptionParametersInsecure
            ((qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             user_password,owner_password,allow_print != 0,allow_modify != 0,allow_extract != 0,
             allow_annotate != 0);
  return;
}

Assistant:

void
qpdf_set_r2_encryption_parameters_insecure(
    qpdf_data qpdf,
    char const* user_password,
    char const* owner_password,
    QPDF_BOOL allow_print,
    QPDF_BOOL allow_modify,
    QPDF_BOOL allow_extract,
    QPDF_BOOL allow_annotate)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_set_r2_encryption_parameters_insecure");
    qpdf->qpdf_writer->setR2EncryptionParametersInsecure(
        user_password,
        owner_password,
        allow_print != QPDF_FALSE,
        allow_modify != QPDF_FALSE,
        allow_extract != QPDF_FALSE,
        allow_annotate != QPDF_FALSE);
}